

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

uint32_t helper_mvclu(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  uintptr_t unaff_retaddr;
  uint64_t srclen;
  uint64_t dest;
  uint64_t src;
  uint64_t destlen;
  
  iVar5 = r1 + 1;
  uVar3 = (env->psw).mask;
  bVar6 = (uVar3 & 0x100000000) != 0;
  destlen = (ulong)((uint)env->regs[iVar5] & 0x7fffffff);
  if (bVar6) {
    destlen = env->regs[iVar5];
  }
  dest = env->regs[(int)r1];
  if (!bVar6) {
    if ((int)uVar3 < 0) {
      dest = (uint64_t)((uint)dest & 0x7fffffff);
    }
    else {
      dest = (uint64_t)((uint)dest & 0xffffff);
    }
  }
  iVar4 = r3 + 1;
  bVar6 = (uVar3 & 0x100000000) != 0;
  srclen = (ulong)((uint)env->regs[iVar4] & 0x7fffffff);
  if (bVar6) {
    srclen = env->regs[iVar4];
  }
  src = env->regs[(int)r3];
  if (!bVar6) {
    if ((int)uVar3 < 0) {
      src = (uint64_t)((uint)src & 0x7fffffff);
    }
    else {
      src = (uint64_t)((uint)src & 0xffffff);
    }
  }
  uVar1 = do_mvcl(env,&dest,&destlen,&src,&srclen,(uint16_t)a2,2,unaff_retaddr);
  if (((env->psw).mask & 0x100000000) == 0) {
    destlen = destlen & 0xffffffff | env->regs[iVar5] & 0xffffffff00000000;
  }
  env->regs[iVar5] = destlen;
  if (((env->psw).mask & 0x100000000) == 0) {
    srclen = srclen & 0xffffffff | env->regs[iVar4] & 0xffffffff00000000;
  }
  env->regs[iVar4] = srclen;
  uVar3 = (env->psw).mask;
  if ((uVar3 & 0x100000000) == 0) {
    if ((int)uVar3 < 0) {
      uVar2 = (uint)dest & 0x7fffffff;
      uVar3 = env->regs[(int)r1] & 0xffffffff00000000;
    }
    else {
      uVar3 = env->regs[(int)r1] & 0xffffffffff000000;
      uVar2 = (uint)dest & 0xffffff;
    }
    dest = uVar2 | uVar3;
  }
  env->regs[(int)r1] = dest;
  uVar3 = (env->psw).mask;
  if ((uVar3 & 0x100000000) == 0) {
    if ((int)uVar3 < 0) {
      src = (ulong)((uint)src & 0x7fffffff) | env->regs[(int)r3] & 0xffffffff00000000;
    }
    else {
      src = (ulong)((uint)src & 0xffffff) | env->regs[(int)r3] & 0xffffffffff000000;
    }
  }
  env->regs[(int)r3] = src;
  return uVar1;
}

Assistant:

uint32_t HELPER(mvclu)(CPUS390XState *env, uint32_t r1, uint64_t a2,
                       uint32_t r3)
{
    uintptr_t ra = GETPC();
    uint64_t destlen = get_length(env, r1 + 1);
    uint64_t dest = get_address(env, r1);
    uint64_t srclen = get_length(env, r3 + 1);
    uint64_t src = get_address(env, r3);
    uint16_t pad = a2;
    uint32_t cc;

    cc = do_mvcl(env, &dest, &destlen, &src, &srclen, pad, 2, ra);

    set_length(env, r1 + 1, destlen);
    set_length(env, r3 + 1, srclen);
    set_address(env, r1, dest);
    set_address(env, r3, src);

    return cc;
}